

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O2

void __thiscall
TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoPrism>_>::TPZGeoElRefLess
          (TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoPrism>_> *this,
          TPZGeoBlend<pzgeom::TPZGeoPrism> *geo,int matind,TPZGeoMesh *mesh)

{
  long lVar1;
  
  *(undefined ***)&this->super_TPZGeoEl = &PTR__TPZSavable_016cc648;
  TPZGeoEl::TPZGeoEl(&this->super_TPZGeoEl,&PTR_PTR_016c6b18,matind,mesh);
  *(undefined ***)&this->super_TPZGeoEl = &PTR__TPZGeoElRefLess_016c6818;
  pzgeom::TPZGeoBlend<pzgeom::TPZGeoPrism>::TPZGeoBlend(&this->fGeo,geo);
  lVar1 = 0x1c10;
  do {
    *(undefined ***)
     ((long)(this->fGeo).super_TPZGeoPrism.super_TPZNodeRep<6,_pztopology::TPZPrism>.fNodeIndexes +
     lVar1 + -0x58) = &PTR__TPZGeoElSideIndex_016b1180;
    *(undefined4 *)
     ((long)(this->fGeo).super_TPZGeoPrism.super_TPZNodeRep<6,_pztopology::TPZPrism>.fNodeIndexes +
     lVar1 + -0x48) = 0xffffffff;
    *(undefined8 *)
     ((long)(this->fGeo).super_TPZGeoPrism.super_TPZNodeRep<6,_pztopology::TPZPrism>.fNodeIndexes +
     lVar1 + -0x50) = 0xffffffffffffffff;
    lVar1 = lVar1 + 0x18;
  } while (lVar1 != 0x1e08);
  for (lVar1 = 0x1c10; lVar1 != 0x1e08; lVar1 = lVar1 + 0x18) {
    *(undefined8 *)
     ((long)(this->fGeo).super_TPZGeoPrism.super_TPZNodeRep<6,_pztopology::TPZPrism>.fNodeIndexes +
     lVar1 + -0x50) = 0xffffffffffffffff;
    *(undefined4 *)
     ((long)(this->fGeo).super_TPZGeoPrism.super_TPZNodeRep<6,_pztopology::TPZPrism>.fNodeIndexes +
     lVar1 + -0x48) = 0xffffffff;
  }
  pzgeom::TPZGeoBlend<pzgeom::TPZGeoPrism>::Initialize(&this->fGeo,&this->super_TPZGeoEl);
  return;
}

Assistant:

TPZGeoElRefLess<TGeo>::TPZGeoElRefLess(TGeo &geo,int matind,TPZGeoMesh &mesh) :
TPZRegisterClassId(&TPZGeoElRefLess<TGeo>::ClassId), TPZGeoEl(matind,mesh), fGeo(geo) {
	int i;
	for(i=0;i<TGeo::NSides;i++)fNeighbours[i] = TPZGeoElSideIndex();
    fGeo.Initialize(this);
}